

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawMeshIndirectCount
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset,VkBuffer CountBuffer,
          VkDeviceSize CountBufferOffset,uint32_t MaxDrawCount,uint32_t Stride)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_a8 [8];
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  uint32_t MaxDrawCount_local;
  VkDeviceSize CountBufferOffset_local;
  VkBuffer CountBuffer_local;
  VkDeviceSize Offset_local;
  VkBuffer Buffer_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = MaxDrawCount;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])CountBuffer);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMeshIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xdb);
    std::__cxx11::string::~string((string *)local_58);
  }
  bVar1 = IsInRenderScope(this);
  if (!bVar1) {
    Diligent::FormatString<char[71]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [71])
               "vkCmdDrawMeshTasksIndirectCountEXT() must be called inside render pass");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMeshIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xdc);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>((string *)local_a8,(char (*) [27])"No graphics pipeline bound")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMeshIndirectCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xdd);
    std::__cxx11::string::~string((string *)local_a8);
  }
  (*vkCmdDrawMeshTasksIndirectCountEXT)
            (this->m_VkCmdBuffer,Buffer,Offset,CountBuffer,CountBufferOffset,msg.field_2._12_4_,
             Stride);
  return;
}

Assistant:

__forceinline void DrawMeshIndirectCount(VkBuffer Buffer, VkDeviceSize Offset, VkBuffer CountBuffer, VkDeviceSize CountBufferOffset, uint32_t MaxDrawCount, uint32_t Stride)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(), "vkCmdDrawMeshTasksIndirectCountEXT() must be called inside render pass");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDrawMeshTasksIndirectCountEXT(m_VkCmdBuffer, Buffer, Offset, CountBuffer, CountBufferOffset, MaxDrawCount, Stride);
#else
        UNSUPPORTED("DrawMeshIndirectCount is not supported when vulkan library is linked statically");
#endif
    }